

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QLayoutItem * __thiscall
QMainWindowLayoutState::unplug
          (QMainWindowLayoutState *this,QList<int> *path,QMainWindowLayoutState *other)

{
  int iVar1;
  QLayoutItem *pQVar2;
  QToolBarAreaLayout *other_00;
  long in_FS_OFFSET;
  QArrayDataPointer<int> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *(path->d).ptr;
  if (iVar1 == 1) {
    QList<int>::mid((QList<int> *)&QStack_38,path,1,-1);
    pQVar2 = QDockAreaLayout::unplug(&this->dockAreaLayout,(QList<int> *)&QStack_38);
  }
  else {
    if (iVar1 != 0) {
      pQVar2 = (QLayoutItem *)0x0;
      goto LAB_00400a0d;
    }
    QList<int>::mid((QList<int> *)&QStack_38,path,1,-1);
    other_00 = &other->toolBarAreaLayout;
    if (other == (QMainWindowLayoutState *)0x0) {
      other_00 = (QToolBarAreaLayout *)0x0;
    }
    pQVar2 = QToolBarAreaLayout::unplug(&this->toolBarAreaLayout,(QList<int> *)&QStack_38,other_00);
  }
  QArrayDataPointer<int>::~QArrayDataPointer(&QStack_38);
LAB_00400a0d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return pQVar2;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QMainWindowLayoutState::unplug(const QList<int> &path, QMainWindowLayoutState *other)
{
    int i = path.first();

#if !QT_CONFIG(toolbar)
    Q_UNUSED(other);
#else
    if (i == 0)
        return toolBarAreaLayout.unplug(path.mid(1), other ? &other->toolBarAreaLayout : nullptr);
#endif

#if QT_CONFIG(dockwidget)
    if (i == 1)
        return dockAreaLayout.unplug(path.mid(1));
#endif // QT_CONFIG(dockwidget)

    return nullptr;
}